

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O0

bool __thiscall libcellml::Model::doEquals(Model *this,EntityPtr *other)

{
  bool bVar1;
  ModelImpl *this_00;
  undefined1 local_30 [8];
  shared_ptr<libcellml::Model> model;
  EntityPtr *other_local;
  Model *this_local;
  
  model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)other;
  bVar1 = ComponentEntity::doEquals(&this->super_ComponentEntity,other);
  if (bVar1) {
    std::dynamic_pointer_cast<libcellml::Model,libcellml::Entity>
              ((shared_ptr<libcellml::Entity> *)local_30);
    bVar1 = std::operator!=((shared_ptr<libcellml::Model> *)local_30,(nullptr_t)0x0);
    if (bVar1) {
      this_00 = pFunc(this);
      bVar1 = ModelImpl::equalUnits(this_00,(ModelPtr *)local_30);
      if (!bVar1) goto LAB_003250b8;
      this_local._7_1_ = 1;
      bVar1 = true;
    }
    else {
LAB_003250b8:
      bVar1 = false;
    }
    std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_30);
    if (bVar1) goto LAB_003250d9;
  }
  this_local._7_1_ = 0;
LAB_003250d9:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Model::doEquals(const EntityPtr &other) const
{
    if (ComponentEntity::doEquals(other)) {
        auto model = std::dynamic_pointer_cast<Model>(other);
        if ((model != nullptr) && pFunc()->equalUnits(model)) {
            return true;
        }
    }
    return false;
}